

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QBackingStore * __thiscall QWidget::backingStore(QWidget *this)

{
  long lVar1;
  QBackingStore *pQVar2;
  
  while (((lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78), lVar1 == 0 ||
          (lVar1 = *(long *)(lVar1 + 8), lVar1 == 0)) ||
         (pQVar2 = *(QBackingStore **)(lVar1 + 0x10), pQVar2 == (QBackingStore *)0x0))) {
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      return (QBackingStore *)0x0;
    }
    this = window(this);
  }
  return pQVar2;
}

Assistant:

QBackingStore *QWidget::backingStore() const
{
    Q_D(const QWidget);
    QTLWExtra *extra = d->maybeTopData();
    if (extra && extra->backingStore)
        return extra->backingStore;

    if (!isWindow())
        return window()->backingStore();

    return nullptr;
}